

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O2

float stbir__filter_catmullrom(float x,float s)

{
  float fVar1;
  
  fVar1 = ABS(x);
  if (fVar1 < 1.0) {
    return 1.0 - x * x * (fVar1 * -1.5 + 2.5);
  }
  if (fVar1 < 2.0) {
    return 2.0 - ((fVar1 * 0.5 + -2.5) * fVar1 + 4.0) * fVar1;
  }
  return 0.0;
}

Assistant:

static float stbir__filter_catmullrom(float x, float s)
{
    STBIR__UNUSED_PARAM(s);

    x = (float)fabs(x);

    if (x < 1.0f)
        return 1 - x*x*(2.5f - 1.5f*x);
    else if (x < 2.0f)
        return 2 - x*(4 + x*(0.5f*x - 2.5f));

    return (0.0f);
}